

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O3

int __thiscall ncnn::Pooling1D::forward(Pooling1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  int *piVar7;
  int k;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  float fVar22;
  void *local_90;
  Mat local_88;
  long local_40;
  long local_38;
  
  uVar9 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar14 = (ulong)uVar2;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      make_padding(this,bottom_blob,&local_88,opt);
      iVar10 = local_88.h;
      iVar3 = local_88.w;
      iVar13 = -100;
      if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        uVar14 = (ulong)(uint)local_88.h;
        iVar8 = (local_88.w - this->kernel_w) / this->stride_w;
        uVar9 = iVar8 + 1;
        Mat::create(top_blob,uVar9,local_88.h,sVar4,opt->blob_allocator);
        pvVar5 = top_blob->data;
        if ((pvVar5 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar13 = 0;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar13 = 0;
              iVar12 = 0;
              if (this->pad_mode == 0) {
                iVar12 = (bottom_blob->w - local_88.w) + this->pad_left + this->pad_right;
              }
              if (0 < iVar10) {
                local_90 = local_88.data;
                local_40 = (long)top_blob->w * top_blob->elemsize;
                iVar10 = this->stride_w;
                uVar2 = this->kernel_w;
                local_38 = (long)local_88.w *
                           CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                uVar19 = 0;
                do {
                  if (-1 < iVar8) {
                    iVar13 = this->pad_left;
                    lVar17 = 0;
                    uVar20 = 0;
                    pvVar16 = local_90;
                    do {
                      fVar22 = NAN;
                      if (0 < (int)uVar2) {
                        fVar22 = 0.0;
                        uVar11 = 0;
                        iVar18 = 0;
                        do {
                          if ((long)iVar13 <= (long)(uVar11 + lVar17)) {
                            if ((long)((iVar12 + iVar3) - this->pad_right) <=
                                (long)(uVar11 + lVar17)) break;
                            fVar22 = fVar22 + *(float *)((long)pvVar16 + uVar11 * 4);
                            iVar18 = iVar18 + 1;
                          }
                          uVar11 = uVar11 + 1;
                        } while (uVar2 != uVar11);
                        fVar22 = fVar22 / (float)iVar18;
                      }
                      *(float *)((long)pvVar5 + uVar20 * 4 + local_40 * uVar19) = fVar22;
                      uVar20 = uVar20 + 1;
                      pvVar16 = (void *)((long)pvVar16 + (long)iVar10 * 4);
                      lVar17 = lVar17 + iVar10;
                    } while (uVar20 != uVar9);
                  }
                  uVar19 = uVar19 + 1;
                  local_90 = (void *)((long)local_90 + local_38);
                  iVar13 = 0;
                } while (uVar19 != uVar14);
              }
            }
            else if (0 < iVar10) {
              iVar3 = top_blob->w;
              sVar4 = top_blob->elemsize;
              uVar2 = this->kernel_w;
              iVar10 = this->stride_w;
              uVar19 = 0;
              iVar13 = 0;
              pvVar16 = local_88.data;
              do {
                if (-1 < iVar8) {
                  uVar20 = 0;
                  pvVar21 = pvVar16;
                  do {
                    fVar22 = 0.0;
                    if (0 < (int)uVar2) {
                      uVar11 = 0;
                      do {
                        fVar22 = fVar22 + *(float *)((long)pvVar21 + uVar11 * 4);
                        uVar11 = uVar11 + 1;
                      } while (uVar2 != uVar11);
                    }
                    *(float *)((long)pvVar5 + uVar20 * 4 + (long)iVar3 * sVar4 * uVar19) =
                         fVar22 * (1.0 / (float)(int)uVar2);
                    uVar20 = uVar20 + 1;
                    pvVar21 = (void *)((long)pvVar21 + (long)iVar10 * 4);
                  } while (uVar20 != uVar9);
                }
                uVar19 = uVar19 + 1;
                pvVar16 = (void *)((long)pvVar16 +
                                  (long)local_88.w *
                                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
              } while (uVar19 != uVar14);
            }
          }
          else {
            iVar13 = 0;
            if ((this->pooling_type == 0) && (0 < iVar10)) {
              lVar17 = (long)local_88.w *
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
              iVar3 = top_blob->w;
              sVar4 = top_blob->elemsize;
              iVar10 = this->stride_w;
              uVar2 = this->kernel_w;
              uVar19 = 0;
              pvVar16 = local_88.data;
              do {
                if (-1 < iVar8) {
                  uVar20 = 0;
                  pvVar21 = pvVar16;
                  do {
                    fVar22 = *(float *)((long)local_88.data +
                                       uVar20 * (long)iVar10 * 4 + lVar17 * uVar19);
                    if (0 < (int)uVar2) {
                      uVar11 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar21 + uVar11 * 4);
                        if (fVar22 <= fVar1) {
                          fVar22 = fVar1;
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar2 != uVar11);
                    }
                    *(float *)((long)pvVar5 + uVar20 * 4 + (long)iVar3 * sVar4 * uVar19) = fVar22;
                    uVar20 = uVar20 + 1;
                    pvVar21 = (void *)((long)pvVar21 + (long)iVar10 * 4);
                  } while (uVar20 != uVar9);
                }
                uVar19 = uVar19 + 1;
                pvVar16 = (void *)((long)pvVar16 + lVar17);
              } while (uVar19 != uVar14);
              iVar13 = 0;
            }
          }
        }
      }
      piVar7 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (**(code **)(*(long *)local_88.allocator + 0x18))();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,uVar2,sVar4,opt->blob_allocator);
      pvVar5 = top_blob->data;
      iVar13 = -100;
      if ((pvVar5 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar13 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar2) {
            lVar17 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar16 = bottom_blob->data;
            iVar3 = top_blob->w;
            sVar4 = top_blob->elemsize;
            uVar2 = this->out_w;
            uVar19 = 0;
            pvVar21 = pvVar16;
            do {
              if (0 < (int)uVar2) {
                uVar20 = 0;
                do {
                  iVar13 = (int)((int)uVar20 * uVar9) / (int)uVar2;
                  uVar11 = uVar20 + 1;
                  iVar10 = (int)((int)uVar11 * uVar9 + (uVar2 - 1)) / (int)uVar2;
                  lVar15 = (long)iVar13;
                  fVar22 = *(float *)((long)pvVar16 + lVar15 * 4 + lVar17 * uVar19);
                  if (iVar13 < iVar10) {
                    do {
                      fVar1 = *(float *)((long)pvVar21 + lVar15 * 4);
                      if (fVar22 <= fVar1) {
                        fVar22 = fVar1;
                      }
                      lVar15 = lVar15 + 1;
                    } while (iVar10 != lVar15);
                  }
                  *(float *)((long)pvVar5 + uVar20 * 4 + (long)iVar3 * sVar4 * uVar19) = fVar22;
                  uVar20 = uVar11;
                } while (uVar11 != uVar2);
              }
              uVar19 = uVar19 + 1;
              pvVar21 = (void *)((long)pvVar21 + lVar17);
              iVar13 = 0;
            } while (uVar19 != uVar14);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar2)) {
          pvVar16 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          iVar10 = top_blob->w;
          sVar4 = top_blob->elemsize;
          uVar2 = this->out_w;
          sVar6 = bottom_blob->elemsize;
          uVar19 = 0;
          iVar13 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar20 = 0;
              do {
                iVar12 = (int)((int)uVar20 * uVar9) / (int)uVar2;
                uVar11 = uVar20 + 1;
                iVar8 = (int)((int)uVar11 * uVar9 + (uVar2 - 1)) / (int)uVar2;
                fVar22 = 0.0;
                if (iVar8 - iVar12 != 0 && iVar12 <= iVar8) {
                  lVar17 = (long)iVar12;
                  do {
                    fVar22 = fVar22 + *(float *)((long)pvVar16 + lVar17 * 4);
                    lVar17 = lVar17 + 1;
                  } while (iVar8 != lVar17);
                }
                *(float *)((long)pvVar5 + uVar20 * 4 + (long)iVar10 * sVar4 * uVar19) =
                     fVar22 / (float)(iVar8 - iVar12);
                uVar20 = uVar11;
              } while (uVar11 != uVar2);
            }
            uVar19 = uVar19 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar3 * sVar6);
          } while (uVar19 != uVar14);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar2,sVar4,opt->blob_allocator);
    pvVar5 = top_blob->data;
    iVar13 = -100;
    if ((pvVar5 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (this->pooling_type == 0) {
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar16 = bottom_blob->data;
        lVar17 = (long)bottom_blob->w * bottom_blob->elemsize;
        uVar19 = 0;
        pvVar21 = pvVar16;
        do {
          fVar22 = *(float *)((long)pvVar16 + lVar17 * uVar19);
          if (0 < (int)uVar9) {
            uVar20 = 0;
            do {
              fVar1 = *(float *)((long)pvVar21 + uVar20 * 4);
              if (fVar22 <= fVar1) {
                fVar22 = fVar1;
              }
              uVar20 = uVar20 + 1;
            } while (uVar9 != uVar20);
          }
          *(float *)((long)pvVar5 + uVar19 * 4) = fVar22;
          uVar19 = uVar19 + 1;
          pvVar21 = (void *)((long)pvVar21 + lVar17);
        } while (uVar19 != uVar14);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        iVar3 = bottom_blob->w;
        sVar4 = bottom_blob->elemsize;
        pvVar16 = bottom_blob->data;
        uVar19 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar9) {
            uVar20 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar16 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar9 != uVar20);
          }
          *(float *)((long)pvVar5 + uVar19 * 4) = fVar22 * (1.0 / (float)(int)uVar9);
          uVar19 = uVar19 + 1;
          pvVar16 = (void *)((long)pvVar16 + (long)iVar3 * sVar4);
        } while (uVar19 != uVar14);
      }
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Pooling1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling1D     input %d x %d  pad = %d %d  ksize=%d  stride=%d", w, h, pad_left, pad_right, kernel_w, stride_w);
    if (global_pooling)
    {
        top_blob.create(h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float max = ptr[0];
                for (int i = 0; i < w; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float sum = 0.f;
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / w;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                    float max = inptr[iw0];
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        max = std::max(max, inptr[iw]);
                    }

                    outptr[j] = max;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                    const int wk = iw1 - iw0;

                    float sum = 0;
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        sum += inptr[iw];
                    }

                    outptr[j] = sum / wk;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;

    top_blob.create(outw, h, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < h; q++)
        {
            const float* ptr = bottom_blob_bordered.row(q);
            float* outptr = top_blob.row(q);

            for (int j = 0; j < outw; j++)
            {
                const float* sptr = ptr + j * stride_w;

                float max = sptr[0];

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = sptr[k];
                    max = std::max(max, val);
                }

                outptr[j] = max;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    int sx0 = j * stride_w;

                    float sum = 0;
                    int area = 0;

                    for (int kj = 0; kj < kernel_w; kj++)
                    {
                        int sx = sx0 + kj;

                        if (sx < pad_left)
                            continue;

                        if (sx >= w - pad_right - wtailpad)
                            break;

                        float val = ptr[sx];
                        sum += val;
                        area += 1;
                    }

                    outptr[j] = sum / area;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = ptr + j * stride_w;

                    float sum = 0;

                    for (int k = 0; k < kernel_w; k++)
                    {
                        float val = sptr[k];
                        sum += val;
                    }

                    outptr[j] = sum / kernel_w;
                }
            }
        }
    }

    return 0;
}